

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

Polynom<Rational> __thiscall
Polynom<Rational>::operator*(Polynom<Rational> *this,Polynom<Rational> *a)

{
  int iVar1;
  uint uVar2;
  long in_RDX;
  Rational *extraout_RDX;
  uint uVar3;
  int iVar4;
  Polynom<Rational> PVar5;
  uint local_8c;
  Rational local_70;
  
  Polynom(this,((a->m).N + *(int *)(in_RDX + 4)) - 1);
  if ((a->m).N != 0) {
    iVar1 = 0;
    local_8c = 0;
    do {
      uVar2 = *(uint *)(in_RDX + 4);
      if (uVar2 != 0) {
        uVar3 = 0;
        iVar4 = -1;
        do {
          ::operator*(&local_70,(a->m).arr + ((a->m).N + ~local_8c),
                      (Rational *)((ulong)(uVar2 + iVar4) * 0x40 + *(long *)(in_RDX + 8)));
          Rational::operator+=((this->m).arr + (iVar1 + iVar4 + (this->m).N),&local_70);
          if (local_70._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_70._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar3 = uVar3 + 1;
          uVar2 = *(uint *)(in_RDX + 4);
          iVar4 = iVar4 + -1;
        } while (uVar3 < uVar2);
      }
      local_8c = local_8c + 1;
      iVar1 = iVar1 + -1;
    } while (local_8c < (a->m).N);
  }
  strip(this);
  PVar5.m.arr = extraout_RDX;
  PVar5.m._0_8_ = this;
  return (Polynom<Rational>)PVar5.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::operator*(const Polynom &a) const
{
    Polynom temp(m.width() + a.m.width() - 1);
    for(unsigned i = 0; i < m.width(); ++i)
    {
        for(unsigned j = 0; j < a.m.width(); ++j)
        {
            temp.m[0][temp.m.width() - 1 - i - j] += m[0][m.width() - 1 - i] * a.m[0][a.m.width() - 1 - j];
        }
    }
    temp.strip();
    return temp;
}